

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::SkipAutoProfileForCoroutine(FunctionBody *this)

{
  bool bVar1;
  
  bVar1 = FunctionProxy::IsCoroutine((FunctionProxy *)this);
  return (bool)(bVar1 & DAT_01436248);
}

Assistant:

bool
    FunctionBody::SkipAutoProfileForCoroutine() const
    {
        return this->IsCoroutine() && CONFIG_FLAG(JitES6Generators);
    }